

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

void matrix_expand(matrix *out,uint8_t *rho)

{
  byte bVar1;
  size_t i;
  ulong uVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint8_t input [34];
  byte local_1c8 [176];
  BORINGSSL_keccak_st keccak_ctx;
  
  input._0_8_ = *(undefined8 *)rho;
  input._8_8_ = *(undefined8 *)(rho + 8);
  input._16_8_ = *(undefined8 *)(rho + 0x10);
  input._24_8_ = *(undefined8 *)(rho + 0x18);
  lVar5 = 0;
  do {
    if (lVar5 == 3) {
      return;
    }
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      input[0x20] = (uint8_t)lVar5;
      input[0x21] = (uint8_t)lVar4;
      BORINGSSL_keccak_init(&keccak_ctx,boringssl_shake128);
      BORINGSSL_keccak_absorb(&keccak_ctx,input,0x22);
      if (keccak_ctx.squeeze_offset != 0) {
        __assert_fail("keccak_ctx->squeeze_offset == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                      ,0x135,
                      "void scalar_from_keccak_vartime(scalar *, struct BORINGSSL_keccak_st *)");
      }
      if (keccak_ctx.rate_bytes != 0xa8) {
        __assert_fail("keccak_ctx->rate_bytes == 168",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                      ,0x136,
                      "void scalar_from_keccak_vartime(scalar *, struct BORINGSSL_keccak_st *)");
      }
      iVar7 = 0;
      while (iVar7 < 0x100) {
        BORINGSSL_keccak_squeeze(&keccak_ctx,local_1c8,0xa8);
        uVar2 = 0;
        while ((uVar2 < 0xa8 && (iVar7 < 0x100))) {
          bVar1 = local_1c8[uVar2 + 1];
          uVar3 = (bVar1 & 0xf) << 8 | (ushort)local_1c8[uVar2];
          if (uVar3 < 0xd01) {
            lVar6 = (long)iVar7;
            iVar7 = iVar7 + 1;
            out->v[lVar5][lVar4].c[lVar6] = uVar3;
          }
          uVar3 = (ushort)local_1c8[uVar2 + 2] << 4 | (ushort)(bVar1 >> 4);
          if ((uVar3 < 0xd01) && (iVar7 < 0x100)) {
            lVar6 = (long)iVar7;
            iVar7 = iVar7 + 1;
            out->v[lVar5][lVar4].c[lVar6] = uVar3;
          }
          uVar2 = uVar2 + 3;
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void matrix_expand(matrix *out, const uint8_t rho[32]) {
  uint8_t input[34];
  OPENSSL_memcpy(input, rho, 32);
  for (int i = 0; i < RANK; i++) {
    for (int j = 0; j < RANK; j++) {
      input[32] = i;
      input[33] = j;
      struct BORINGSSL_keccak_st keccak_ctx;
      BORINGSSL_keccak_init(&keccak_ctx, boringssl_shake128);
      BORINGSSL_keccak_absorb(&keccak_ctx, input, sizeof(input));
      scalar_from_keccak_vartime(&out->v[i][j], &keccak_ctx);
    }
  }
}